

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

QRhiRenderTarget * __thiscall
QGles2SwapChain::currentFrameRenderTarget(QGles2SwapChain *this,StereoTargetBuffer targetBuffer)

{
  QGles2SwapChainRenderTarget *pQVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x3b8;
  pQVar1 = &this->rtRight;
  if (targetBuffer == LeftBuffer) {
    lVar3 = 0x220;
    pQVar1 = &this->rtLeft;
  }
  lVar2 = 0x88;
  if ((pQVar1->d).rp != (QGles2RenderPassDescriptor *)0x0) {
    lVar2 = lVar3;
  }
  return (QRhiRenderTarget *)
         ((long)&(((QRhiSwapChain *)(&(this->super_QRhiSwapChain).m_proxyData + -6))->
                 super_QRhiResource)._vptr_QRhiResource + lVar2);
}

Assistant:

QRhiRenderTarget *QGles2SwapChain::currentFrameRenderTarget(StereoTargetBuffer targetBuffer)
{
    if (targetBuffer == LeftBuffer)
        return rtLeft.d.isValid() ? &rtLeft : &rt;
    else if (targetBuffer == RightBuffer)
        return rtRight.d.isValid() ? &rtRight : &rt;
    else
        Q_UNREACHABLE_RETURN(nullptr);
}